

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O3

void __thiscall
TPZTransfer<std::complex<double>_>::TransferSolution
          (TPZTransfer<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *coarsesol,
          TPZFMatrix<std::complex<double>_> *finesol)

{
  ulong uVar1;
  int64_t iVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  complex<double> *pcVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  TPZFMatrix<std::complex<double>_> tempcoarse;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  uVar15 = (coarsesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  uVar1 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  iVar2 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  iVar14 = *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.field_0x1c;
  iVar8 = (int)uVar15;
  iVar13 = (int)uVar1;
  if (((int)(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol != iVar8) ||
     ((long)(int)(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow !=
      (long)iVar14 * uVar1)) {
    (*(finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])(finesol,(long)(iVar14 * iVar13),(long)iVar8);
    iVar14 = *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.field_0x1c;
  }
  if (iVar14 == 1) {
    MultiplyScalar(this,coarsesol,finesol,0);
    return;
  }
  if (0 < iVar14) {
    lVar6 = (long)(int)iVar2;
    lVar12 = (long)iVar8;
    uVar9 = lVar6 * lVar12;
    uVar10 = iVar13 * lVar12;
    uVar15 = uVar15 & 0x7fffffff;
    iVar14 = 0;
    do {
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
      local_150.fSize = 0;
      local_150.fElem = (complex<double> *)0x0;
      local_150.fGiven = (complex<double> *)0x0;
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar6;
      local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar12;
      TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
      local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
      local_150.fPivot.super_TPZVec<int>.fNElements = 0;
      local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
      local_150.fWork.fNAlloc = 0;
      local_150.fWork.fStore = (complex<double> *)0x0;
      local_150.fWork.fNElements = 0;
      if (uVar9 != 0) {
        pcVar7 = (complex<double> *)operator_new__(-(ulong)(uVar9 >> 0x3c != 0) | uVar9 * 0x10);
        memset(pcVar7,0,uVar9 * 0x10);
        local_150.fElem = pcVar7;
      }
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
      local_c0.fElem = (complex<double> *)0x0;
      local_c0.fGiven = (complex<double> *)0x0;
      local_c0.fSize = 0;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = (long)iVar13;
      local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar12;
      TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
      local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
      local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
      local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
      local_c0.fWork.fStore = (complex<double> *)0x0;
      local_c0.fWork.fNElements = 0;
      local_c0.fWork.fNAlloc = 0;
      if (uVar10 != 0) {
        pcVar7 = (complex<double> *)operator_new__(-(ulong)(uVar10 >> 0x3c != 0) | uVar10 * 0x10);
        memset(pcVar7,0,uVar10 * 0x10);
        local_c0.fElem = pcVar7;
      }
      if (0 < iVar13) {
        uVar16 = 0;
        do {
          if (0 < iVar8) {
            uVar11 = 0;
            do {
              (*(coarsesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                super_TPZSavable._vptr_TPZSavable[0x24])
                        (coarsesol,
                         (long)(*(int *)&(this->super_TPZMatrix<std::complex<double>_>).
                                         super_TPZBaseMatrix.field_0x1c * (int)uVar16 + iVar14),
                         uVar11);
              if ((local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <=
                   (long)uVar16) ||
                 (local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
                  (long)uVar11)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(ulong *)local_150.fElem
                        [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                         uVar11 + uVar16]._M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
              *(undefined8 *)
               ((long)local_150.fElem
                      [local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                       uVar11 + uVar16]._M_value + 8) = in_XMM1_Qa;
              uVar11 = uVar11 + 1;
            } while (uVar15 != uVar11);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uVar1 & 0x7fffffff));
      }
      MultiplyScalar(this,&local_150,&local_c0,0);
      if (0 < iVar13) {
        uVar16 = 0;
        do {
          if (0 < iVar8) {
            uVar11 = 0;
            do {
              uVar4 = *(undefined8 *)
                       ((long)local_c0.fElem
                              [local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                               fRow * uVar11 + uVar16]._M_value + 8);
              iVar5 = *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c * (int)uVar16 + iVar14;
              if (((iVar5 < 0) ||
                  (lVar3 = (finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                           fRow, lVar3 <= iVar5)) ||
                 ((finesol->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <=
                  (long)uVar11)) {
                TPZFMatrix<std::complex<double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pcVar7 = finesol->fElem;
              *(undefined8 *)pcVar7[lVar3 * uVar11 + (long)iVar5]._M_value =
                   *(undefined8 *)
                    local_c0.fElem
                    [local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
                     uVar11 + uVar16]._M_value;
              *(undefined8 *)(pcVar7[lVar3 * uVar11 + (long)iVar5]._M_value + 8) = uVar4;
              uVar11 = uVar11 + 1;
            } while (uVar15 != uVar11);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uVar1 & 0x7fffffff));
      }
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
      TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
      iVar14 = iVar14 + 1;
    } while (iVar14 < *(int *)&(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.
                               field_0x1c);
  }
  return;
}

Assistant:

void TPZTransfer<TVar>::TransferSolution(const TPZFMatrix<TVar> &coarsesol, TPZFMatrix<TVar> &finesol){
	int iv;
	int nrf = finesol.Rows();
	int ncf = finesol.Cols();
	int nrc = coarsesol.Rows();
	int ncc = coarsesol.Cols();
    int thisr = this->Rows();
    int thisc = this->Cols();
	if(nrf != this->Rows()*fNTVarVar || ncf != ncc) {
		nrf = this->Rows()*fNTVarVar;
		ncf = ncc;
		finesol.Redim(nrf,ncf);
	}
    if (fNTVarVar == 1) {
        MultiplyScalar(coarsesol,finesol,0);
    }
    else
    {
        for(iv=0; iv<fNTVarVar; iv++) {
            TPZFMatrix<TVar> tempcoarse(thisc,ncc), tempfine(thisr,ncf);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    tempcoarse(i,c) = coarsesol.GetVal(iv+i*fNTVarVar,c);

                }
            }
            MultiplyScalar(tempcoarse, tempfine, 0);
            for (int i=0; i<thisr; i++) {
                for (int c=0; c<ncf; c++) {
                    finesol(iv+i*fNTVarVar,c) = tempfine.GetVal(i,c);
                    
                }
            }
        }
    }
}